

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O1

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *pAVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar5;
  
  if (p->pNodeToFrames[pObj->Id * p->nFrames + f] != (Aig_Obj_t *)0x0) {
    return p->pNodeToFrames[pObj->Id * p->nFrames + f];
  }
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar4 & 7) == 2) {
    pAVar1 = p->pAig;
    if ((pObj->field_0).CioId < pAVar1->nTruePis) {
      __assert_fail("!Saig_ObjIsPi(p->pAig, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0x178,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
    if (pAVar1->nTruePis <= (pObj->field_0).CioId) {
      if (f < 1) {
        __assert_fail("f > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                      ,0x17b,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      if ((pObj->field_0).CioId < pAVar1->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar4 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
      if (((int)uVar4 < 0) || (pAVar1->vCos->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAVar1->vCos->pArray[uVar4];
      pAVar5 = Ssw_ManSweepBmcConstr_rec
                         (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),f + -1)
      ;
      pAVar5 = (Aig_Obj_t *)((ulong)((uint)*(undefined8 *)((long)pvVar2 + 8) & 1) ^ (ulong)pAVar5);
      goto LAB_006a0405;
    }
  }
  if ((uVar4 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                  ,0x182,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
  }
  Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
  Ssw_ManSweepBmcConstr_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswInt.h"
                  ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
  }
  uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar3 == 0) {
    pAVar5 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar5 = (Aig_Obj_t *)
             ((ulong)((uint)pObj->pFanin0 & 1) ^
             (ulong)p->pNodeToFrames[*(int *)(uVar3 + 0x24) * p->nFrames + f]);
  }
  uVar3 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar3 == 0) {
    p1 = (Aig_Obj_t *)0x0;
  }
  else {
    p1 = (Aig_Obj_t *)
         ((ulong)((uint)pObj->pFanin1 & 1) ^
         (ulong)p->pNodeToFrames[*(int *)(uVar3 + 0x24) * p->nFrames + f]);
  }
  pAVar5 = Aig_And(p->pFrames,pAVar5,p1);
LAB_006a0405:
  p->pNodeToFrames[pObj->Id * p->nFrames + f] = pAVar5;
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    return pAVar5;
  }
  __assert_fail("pObjNew != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                ,0x188,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjNew, * pObjLi;
    pObjNew = Ssw_ObjFrame( p, pObj, f );
    if ( pObjNew )
        return pObjNew;
    assert( !Saig_ObjIsPi(p->pAig, pObj) );
    if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( f > 0 );
        pObjLi  = Saig_ObjLoToLi( p->pAig, pObj );
        pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObjLi), f-1 );
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObjLi) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin1(pObj), f );
        pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
    }
    Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    assert( pObjNew != NULL );
    return pObjNew;
}